

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall
fizplex::ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test::TestBody
          (ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test *this)

{
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector::Nonzero> l_02;
  initializer_list<fizplex::SVector> colList;
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  SVector new_col;
  ColMatrix m;
  size_t in_stack_fffffffffffffdb8;
  ColMatrix *in_stack_fffffffffffffdc0;
  SVector *in_stack_fffffffffffffdc8;
  ColMatrix *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  iterator in_stack_fffffffffffffdf8;
  ColMatrix *in_stack_fffffffffffffe00;
  undefined1 ***pppuVar2;
  iterator in_stack_fffffffffffffe08;
  undefined1 ***pppuVar3;
  size_type in_stack_fffffffffffffe10;
  AssertHelper local_1e8;
  Message local_1e0;
  AssertionResult local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined1 **local_90;
  undefined8 *local_88 [3];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined1 **local_40;
  undefined8 local_38;
  
  local_90 = (undefined1 **)local_88;
  local_b8 = 1;
  uStack_b0 = 0;
  local_c8 = 2;
  uStack_c0 = 0xc008000000000000;
  local_d8 = 0;
  uStack_d0 = 0x401c000000000000;
  local_a0 = &local_d8;
  local_98 = 3;
  l._M_len = (size_type)in_stack_fffffffffffffe00;
  l._M_array = in_stack_fffffffffffffdf8;
  SVector::SVector((SVector *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),l);
  local_90 = (undefined1 **)local_70;
  local_108 = 2;
  uStack_100 = 0x4010000000000000;
  local_118 = 1;
  uStack_110 = 0x4008000000000000;
  local_128 = 0;
  uStack_120 = 0x4000000000000000;
  local_f8 = &local_128;
  local_f0 = 3;
  l_00._M_len = (size_type)in_stack_fffffffffffffe00;
  l_00._M_array = in_stack_fffffffffffffdf8;
  SVector::SVector((SVector *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),l_00);
  local_90 = (undefined1 **)local_58;
  local_148 = 2;
  uStack_140 = 0xc000000000000000;
  local_158 = 1;
  uStack_150 = 0xbff0000000000000;
  local_168 = 0;
  uStack_160 = 0x3ff0000000000000;
  local_138 = &local_168;
  local_130 = 3;
  l_01._M_len = (size_type)in_stack_fffffffffffffe00;
  l_01._M_array = in_stack_fffffffffffffdf8;
  SVector::SVector((SVector *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),l_01);
  local_40 = (undefined1 **)local_88;
  local_38 = 3;
  colList._M_len = in_stack_fffffffffffffe10;
  colList._M_array = in_stack_fffffffffffffe08;
  ColMatrix::ColMatrix
            (in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8,
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),colList);
  pppuVar3 = (undefined1 ***)local_88;
  pppuVar2 = &local_40;
  do {
    pppuVar2 = pppuVar2 + -3;
    SVector::~SVector((SVector *)0x1bb0cb);
  } while (pppuVar2 != pppuVar3);
  local_1a8 = 3;
  uStack_1a0 = 0x4008000000000000;
  local_1b8 = 2;
  uStack_1b0 = 0x4000000000000000;
  local_1c8 = 0;
  uStack_1c0 = 0x3ff0000000000000;
  local_190 = &local_1c8;
  local_188 = 3;
  l_02._M_len = (size_type)pppuVar2;
  l_02._M_array = in_stack_fffffffffffffdf8;
  SVector::SVector((SVector *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),l_02);
  ColMatrix::add_column(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  ColMatrix::column(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  testing::internal::EqHelper<false>::Compare<fizplex::SVector,fizplex::SVector>
            (in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (SVector *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1bb2d4);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x49,message);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message((Message *)0x1bb322);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1bb36e);
  SVector::~SVector((SVector *)0x1bb37b);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bb388);
  return;
}

Assistant:

TEST(ColMatrix, AddColumnAndValuesToNonEmptyMatrix) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}, {1, 0.0}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector new_col = {{0, 1.0}, {2, 2.0}, {3, 3.0}};
  m.add_column(new_col);
  EXPECT_EQ(new_col, m.column(3));
}